

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::delete_node(table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
              *this,link_pointer prev)

{
  link_pointer ppVar1;
  
  ppVar1 = prev->next_ + -2;
  if (prev->next_ == (link_pointer)0x0) {
    ppVar1 = (link_pointer)0x0;
  }
  prev->next_ = ppVar1[2].next_;
  operator_delete(ppVar1,0x20);
  this->size_ = this->size_ - 1;
  return;
}

Assistant:

void delete_node(link_pointer prev)
        {
            node_pointer n = static_cast<node_pointer>(prev->next_);
            prev->next_ = n->next_;

            boost::unordered::detail::func::destroy_value_impl(node_alloc(),
                n->value_ptr());
            node_allocator_traits::destroy(node_alloc(),
                    boost::addressof(*n));
            node_allocator_traits::deallocate(node_alloc(), n, 1);
            --size_;
        }